

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O3

size_t __thiscall
linq::
IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_bool,_int>_>
::Count(IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_bool,_int>_>
        *this)

{
  function<bool_(const_int_&)> *pfVar1;
  bool bVar2;
  size_t sVar3;
  iterator __end0;
  iterator __begin0;
  iterator local_218;
  OUT local_180;
  iterator local_160;
  iterator local_c8;
  
  begin(&local_c8,this);
  end(&local_160,this);
  pfVar1 = &local_218.source.transformer;
  sVar3 = 0;
  while( true ) {
    local_218.source.super_IState<linq::IGrouping<bool,_int_&>_>._vptr_IState =
         (_func_int **)&PTR_Init_00158648;
    local_218.source.source.source.super_IState<int_&>._vptr_IState =
         (_func_int **)&PTR_Init_00157230;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_218.source.source.source.source,&local_160.source.source.source.source);
    local_218.source.source.source.current._M_current =
         local_160.source.source.source.current._M_current;
    local_218.source.source.source.end._M_current = local_160.source.source.source.end._M_current;
    std::function<bool_(const_int_&)>::function(pfVar1,&local_160.source.transformer);
    std::
    _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::_Rb_tree(&local_218.source.result._M_t,&local_160.source.result._M_t);
    local_218.source.current._M_node = local_160.source.current._M_node;
    local_218.valid = local_160.valid;
    bVar2 = iterator::operator!=(&local_c8,&local_218);
    local_218.source.super_IState<linq::IGrouping<bool,_int_&>_>._vptr_IState =
         (_func_int **)&PTR_Init_00158648;
    std::
    _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::~_Rb_tree(&local_218.source.result._M_t);
    if (local_218.source.transformer.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_218.source.transformer.super__Function_base._M_manager)
                ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
    }
    local_218.source.source.source.super_IState<int_&>._vptr_IState =
         (_func_int **)&PTR_Init_00157230;
    if (local_218.source.source.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_218.source.source.source.source.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start,(long)local_218.source.source.source.source.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage -
                               (long)local_218.source.source.source.source.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start);
    }
    if (!bVar2) break;
    GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_bool,_int>
    ::Current(&local_180,&local_c8.source);
    local_180.super_IEnumerable<int_&>.super_IState<int_&>._vptr_IState =
         (_func_int **)&PTR_Init_00157638;
    if (local_180.super_IEnumerable<int_&>.state.
        super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_180.super_IEnumerable<int_&>.state.
                 super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    local_c8.source.current._M_node =
         (_Base_ptr)std::_Rb_tree_increment(local_c8.source.current._M_node);
    local_c8.valid =
         local_c8.source.current._M_node !=
         &local_c8.source.result._M_t._M_impl.super__Rb_tree_header._M_header;
    sVar3 = sVar3 + 1;
  }
  local_160.source.super_IState<linq::IGrouping<bool,_int_&>_>._vptr_IState =
       (_func_int **)&PTR_Init_00158648;
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_160.source.result._M_t);
  if (local_160.source.transformer.super__Function_base._M_manager != (_Manager_type)0x0) {
    pfVar1 = &local_160.source.transformer;
    (*local_160.source.transformer.super__Function_base._M_manager)
              ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
  }
  local_160.source.source.source.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00157230
  ;
  if (local_160.source.source.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_160.source.source.source.source.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)local_160.source.source.source.source.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)local_160.source.source.source.source.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  local_c8.source.super_IState<linq::IGrouping<bool,_int_&>_>._vptr_IState =
       (_func_int **)&PTR_Init_00158648;
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_c8.source.result._M_t);
  if (local_c8.source.transformer.super__Function_base._M_manager != (_Manager_type)0x0) {
    pfVar1 = &local_c8.source.transformer;
    (*local_c8.source.transformer.super__Function_base._M_manager)
              ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
  }
  local_c8.source.source.source.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00157230;
  if (local_c8.source.source.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.source.source.source.source.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)local_c8.source.source.source.source.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)local_c8.source.source.source.source.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  return sVar3;
}

Assistant:

size_t Count() 
		{
			size_t count = 0; 
			
			for(const auto& _ : *this) 
				count++; 
			
			return count;
		}